

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::detail::scope_exit::~scope_exit(scope_exit *this)

{
  if (this->execute_on_destruction == true) {
    std::function<void_()>::operator()(&this->exit_function);
  }
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

~scope_exit() {
    if (execute_on_destruction) { this->exit_function(); }
  }